

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::ByteSizeLong
          (VisionFeaturePrint_Objects *this)

{
  int iVar1;
  VisionFeaturePrint_Objects_ObjectsVersion VVar2;
  string *value;
  size_t sVar3;
  int cached_size;
  int n;
  int i;
  size_t total_size;
  VisionFeaturePrint_Objects *this_local;
  
  iVar1 = output_size(this);
  _n = google::protobuf::internal::FromIntSize(iVar1);
  _n = _n * 2;
  cached_size = 0;
  iVar1 = output_size(this);
  for (; cached_size < iVar1; cached_size = cached_size + 1) {
    value = output_abi_cxx11_(this,cached_size);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(value);
    _n = sVar3 + _n;
  }
  VVar2 = version(this);
  if (VVar2 != VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_INVALID) {
    VVar2 = version(this);
    sVar3 = google::protobuf::internal::WireFormatLite::EnumSize(VVar2);
    _n = sVar3 + 1 + _n;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(_n);
  this->_cached_size_ = iVar1;
  return _n;
}

Assistant:

size_t VisionFeaturePrint_Objects::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  size_t total_size = 0;

  // repeated string output = 100;
  total_size += 2 *
      ::google::protobuf::internal::FromIntSize(this->output_size());
  for (int i = 0, n = this->output_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->output(i));
  }

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
  if (this->version() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->version());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}